

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>>
               (char *label_id,GetterXsYs<float> *get_mark,GetterXsYRef<float> *get_base)

{
  float fVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  bool bVar4;
  TransformerLogLog transformer;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  ImPlotPoint IVar9;
  bool bVar10;
  ImU32 IVar11;
  ImU32 col_mk_fill;
  long lVar12;
  ImDrawList *DrawList;
  ImPlotContext *pIVar13;
  int iVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  int iVar18;
  ImPlotPoint local_98;
  ulong local_80;
  ulong local_78;
  float *local_70;
  ulong local_68;
  float *local_60;
  float *local_58;
  ImPlotContext *local_50;
  float *local_48;
  undefined8 uStack_40;
  
  bVar10 = BeginItem(label_id,0);
  if (bVar10) {
    if ((GImPlot->FitThisFrame == true) && (0 < get_base->Count)) {
      iVar14 = 0;
      do {
        iVar18 = get_mark->Count;
        lVar12 = (long)(((get_mark->Offset + iVar14) % iVar18 + iVar18) % iVar18) *
                 (long)get_mark->Stride;
        dVar8 = (double)*(float *)((long)get_mark->Ys + lVar12);
        local_98.y._0_4_ = SUB84(dVar8,0);
        local_98.x = (double)*(float *)((long)get_mark->Xs + lVar12);
        local_98.y._4_4_ = (int)((ulong)dVar8 >> 0x20);
        FitPoint(&local_98);
        iVar18 = get_base->Count;
        local_98.y = get_base->YRef;
        local_98.x = (double)*(float *)((long)get_base->Xs +
                                       (long)(((get_base->Offset + iVar14) % iVar18 + iVar18) %
                                             iVar18) * (long)get_base->Stride);
        FitPoint(&local_98);
        iVar14 = iVar14 + 1;
      } while (iVar14 < get_base->Count);
    }
    pIVar13 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderLine == true) {
      IVar11 = ImGui::GetColorU32((pIVar13->NextItemData).Colors);
      iVar14 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar14]) {
      case 0:
        local_98.x._0_4_ = (float)iVar14;
        RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_98,DrawList,
                   (pIVar13->NextItemData).LineWeight,IVar11);
        break;
      case 1:
        local_98.x._0_4_ = (float)iVar14;
        RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_98,DrawList,
                   (pIVar13->NextItemData).LineWeight,IVar11);
        break;
      case 2:
        local_98.x._0_4_ = (float)iVar14;
        RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_98,DrawList,
                   (pIVar13->NextItemData).LineWeight,IVar11);
        break;
      case 3:
        local_98.x._0_4_ = (float)iVar14;
        RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_98,DrawList,
                   (pIVar13->NextItemData).LineWeight,IVar11);
      }
    }
    iVar14 = (pIVar13->NextItemData).Marker;
    iVar18 = 0;
    if (iVar14 != -1) {
      iVar18 = iVar14;
    }
    IVar11 = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    local_50 = GImPlot;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar14 = get_mark->Count;
      if (0 < iVar14) {
        pfVar15 = get_mark->Xs;
        pfVar16 = get_mark->Ys;
        uVar17 = (ulong)(uint)get_mark->Offset;
        local_58 = (float *)CONCAT44(local_58._4_4_,(pIVar13->NextItemData).MarkerSize);
        local_60 = (float *)CONCAT44(local_60._4_4_,(pIVar13->NextItemData).MarkerWeight);
        iVar5 = get_mark->Stride;
        local_68 = (ulong)iVar18;
        iVar18 = 0;
        bVar10 = (pIVar13->NextItemData).RenderMarkerLine;
        local_80 = CONCAT44(local_80._4_4_,(uint)(pIVar13->NextItemData).RenderMarkerFill);
        pIVar13 = GImPlot;
        local_78 = uVar17;
        local_70 = pfVar16;
        local_48 = pfVar15;
        do {
          IVar9 = local_98;
          lVar12 = (long)((((int)uVar17 + iVar18) % iVar14 + iVar14) % iVar14) * (long)iVar5;
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          local_98.x._0_4_ =
               (float)(pIVar13->Mx *
                       ((double)*(float *)((long)pfVar15 + lVar12) -
                       (pIVar13->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x);
          local_98.x._4_4_ =
               (float)(pIVar13->My[transformer.YAxis] *
                       ((double)*(float *)((long)pfVar16 + lVar12) -
                       pIVar13->CurrentPlot->YAxis[transformer.YAxis].Range.Min) + (double)IVar3.y);
          local_98.y = IVar9.y;
          pIVar6 = local_50->CurrentPlot;
          if ((((pIVar6->PlotRect).Min.x <= local_98.x._0_4_) &&
              (uVar2 = *(undefined8 *)&(pIVar6->PlotRect).Min.y, (float)uVar2 <= local_98.x._4_4_))
             && ((local_98.x._0_4_ < (float)((ulong)uVar2 >> 0x20) &&
                 (local_98.x._4_4_ < (pIVar6->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_68 * 8))
                      (local_58._0_4_,local_60._0_4_,DrawList,&local_98,bVar10,IVar11,
                       local_80 & 0xffffffff,col_mk_fill);
            pIVar13 = GImPlot;
            pfVar15 = local_48;
            pfVar16 = local_70;
            uVar17 = local_78;
          }
          iVar18 = iVar18 + 1;
        } while (iVar14 != iVar18);
      }
      break;
    case 1:
      iVar14 = get_mark->Count;
      if (0 < iVar14) {
        local_58 = get_mark->Xs;
        local_60 = get_mark->Ys;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar13->NextItemData).MarkerSize);
        fVar1 = (pIVar13->NextItemData).MarkerWeight;
        local_70 = (float *)(long)get_mark->Stride;
        local_80 = (ulong)iVar18;
        iVar18 = 0;
        bVar10 = (pIVar13->NextItemData).RenderMarkerLine;
        bVar4 = (pIVar13->NextItemData).RenderMarkerFill;
        do {
          pIVar13 = GImPlot;
          lVar12 = (long)((((int)local_68 + iVar18) % iVar14 + iVar14) % iVar14) * (long)local_70;
          local_48 = (float *)(double)*(float *)((long)local_60 + lVar12);
          uStack_40 = 0;
          dVar8 = log10((double)*(float *)((long)local_58 + lVar12) /
                        (GImPlot->CurrentPlot->XAxis).Range.Min);
          IVar9 = local_98;
          pIVar6 = pIVar13->CurrentPlot;
          dVar7 = (pIVar6->XAxis).Range.Min;
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          local_98.x._0_4_ =
               (float)(pIVar13->Mx *
                       (((double)(float)(dVar8 / pIVar13->LogDenX) *
                         ((pIVar6->XAxis).Range.Max - dVar7) + dVar7) - dVar7) + (double)IVar3.x);
          local_98.x._4_4_ =
               (float)(pIVar13->My[transformer.YAxis] *
                       ((double)local_48 - pIVar6->YAxis[transformer.YAxis].Range.Min) +
                      (double)IVar3.y);
          local_98.y = IVar9.y;
          pIVar6 = local_50->CurrentPlot;
          if ((((pIVar6->PlotRect).Min.x <= local_98.x._0_4_) &&
              ((pIVar6->PlotRect).Min.y <= local_98.x._4_4_)) &&
             ((local_98.x._0_4_ < (pIVar6->PlotRect).Max.x &&
              (local_98.x._4_4_ < (pIVar6->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      ((undefined4)local_78,fVar1,DrawList,&local_98,bVar10,IVar11,bVar4,col_mk_fill
                      );
          }
          iVar18 = iVar18 + 1;
        } while (iVar14 != iVar18);
      }
      break;
    case 2:
      iVar14 = get_mark->Count;
      if (0 < iVar14) {
        local_58 = get_mark->Xs;
        local_60 = get_mark->Ys;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar13->NextItemData).MarkerSize);
        fVar1 = (pIVar13->NextItemData).MarkerWeight;
        local_70 = (float *)(long)get_mark->Stride;
        local_80 = (ulong)iVar18;
        iVar18 = 0;
        bVar10 = (pIVar13->NextItemData).RenderMarkerLine;
        bVar4 = (pIVar13->NextItemData).RenderMarkerFill;
        do {
          pIVar13 = GImPlot;
          lVar12 = (long)((((int)local_68 + iVar18) % iVar14 + iVar14) % iVar14) * (long)local_70;
          local_48 = (float *)(double)*(float *)((long)local_58 + lVar12);
          uStack_40 = 0;
          dVar7 = log10((double)*(float *)((long)local_60 + lVar12) /
                        GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          IVar9 = local_98;
          pIVar6 = pIVar13->CurrentPlot;
          dVar8 = pIVar6->YAxis[transformer.YAxis].Range.Min;
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          local_98.x._0_4_ =
               (float)(pIVar13->Mx * ((double)local_48 - (pIVar6->XAxis).Range.Min) +
                      (double)IVar3.x);
          local_98.x._4_4_ =
               (float)(pIVar13->My[transformer.YAxis] *
                       (((double)(float)(dVar7 / pIVar13->LogDenY[transformer.YAxis]) *
                         (pIVar6->YAxis[transformer.YAxis].Range.Max - dVar8) + dVar8) - dVar8) +
                      (double)IVar3.y);
          local_98.y = IVar9.y;
          pIVar6 = local_50->CurrentPlot;
          if (((((pIVar6->PlotRect).Min.x <= local_98.x._0_4_) &&
               ((pIVar6->PlotRect).Min.y <= local_98.x._4_4_)) &&
              (local_98.x._0_4_ < (pIVar6->PlotRect).Max.x)) &&
             (local_98.x._4_4_ < (pIVar6->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      ((undefined4)local_78,fVar1,DrawList,&local_98,bVar10,IVar11,bVar4,col_mk_fill
                      );
          }
          iVar18 = iVar18 + 1;
        } while (iVar14 != iVar18);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<float>>
                (*get_mark,transformer,DrawList,iVar18,(pIVar13->NextItemData).MarkerSize,
                 (pIVar13->NextItemData).RenderMarkerLine,IVar11,
                 (pIVar13->NextItemData).MarkerWeight,(pIVar13->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}